

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_interleave_pcm_frames
               (ma_format format,ma_uint32 channels,ma_uint64 frameCount,
               void **ppDeinterleavedPCMFrames,void *pInterleavedPCMFrames)

{
  ulong uVar1;
  ulong uVar2;
  ma_uint64 mVar3;
  void *__dest;
  ma_uint64 local_58;
  
  if (format == ma_format_s16) {
    if (frameCount != 0) {
      mVar3 = 0;
      do {
        if (channels != 0) {
          uVar2 = 0;
          do {
            *(undefined2 *)((long)pInterleavedPCMFrames + uVar2 * 2) =
                 *(undefined2 *)((long)ppDeinterleavedPCMFrames[uVar2] + mVar3 * 2);
            uVar2 = uVar2 + 1;
          } while (channels != uVar2);
        }
        mVar3 = mVar3 + 1;
        pInterleavedPCMFrames = (void *)((long)pInterleavedPCMFrames + (ulong)channels * 2);
      } while (mVar3 != frameCount);
    }
  }
  else if (format == ma_format_f32) {
    if (frameCount != 0) {
      mVar3 = 0;
      do {
        if (channels != 0) {
          uVar2 = 0;
          do {
            *(undefined4 *)((long)pInterleavedPCMFrames + uVar2 * 4) =
                 *(undefined4 *)((long)ppDeinterleavedPCMFrames[uVar2] + mVar3 * 4);
            uVar2 = uVar2 + 1;
          } while (channels != uVar2);
        }
        mVar3 = mVar3 + 1;
        pInterleavedPCMFrames = (void *)((long)pInterleavedPCMFrames + (ulong)channels * 4);
      } while (mVar3 != frameCount);
    }
  }
  else if (frameCount != 0) {
    uVar2 = (ulong)(uint)(&DAT_001d0e20)[format];
    local_58 = 0;
    do {
      if (channels != 0) {
        uVar1 = 0;
        __dest = pInterleavedPCMFrames;
        do {
          memcpy(__dest,(void *)((long)ppDeinterleavedPCMFrames[uVar1] + local_58 * uVar2),uVar2);
          uVar1 = uVar1 + 1;
          __dest = (void *)((long)__dest + uVar2);
        } while (channels != uVar1);
      }
      local_58 = local_58 + 1;
      pInterleavedPCMFrames = (void *)((long)pInterleavedPCMFrames + uVar2 * channels);
    } while (local_58 != frameCount);
  }
  return;
}

Assistant:

MA_API void ma_interleave_pcm_frames(ma_format format, ma_uint32 channels, ma_uint64 frameCount, const void** ppDeinterleavedPCMFrames, void* pInterleavedPCMFrames)
{
    switch (format)
    {
        case ma_format_s16:
        {
            ma_int16* pDstS16 = (ma_int16*)pInterleavedPCMFrames;
            ma_uint64 iPCMFrame;
            for (iPCMFrame = 0; iPCMFrame < frameCount; ++iPCMFrame) {
                ma_uint32 iChannel;
                for (iChannel = 0; iChannel < channels; ++iChannel) {
                    const ma_int16* pSrcS16 = (const ma_int16*)ppDeinterleavedPCMFrames[iChannel];
                    pDstS16[iPCMFrame*channels+iChannel] = pSrcS16[iPCMFrame];
                }
            }
        } break;

        case ma_format_f32:
        {
            float* pDstF32 = (float*)pInterleavedPCMFrames;
            ma_uint64 iPCMFrame;
            for (iPCMFrame = 0; iPCMFrame < frameCount; ++iPCMFrame) {
                ma_uint32 iChannel;
                for (iChannel = 0; iChannel < channels; ++iChannel) {
                    const float* pSrcF32 = (const float*)ppDeinterleavedPCMFrames[iChannel];
                    pDstF32[iPCMFrame*channels+iChannel] = pSrcF32[iPCMFrame];
                }
            }
        } break;

        default:
        {
            ma_uint32 sampleSizeInBytes = ma_get_bytes_per_sample(format);
            ma_uint64 iPCMFrame;
            for (iPCMFrame = 0; iPCMFrame < frameCount; ++iPCMFrame) {
                ma_uint32 iChannel;
                for (iChannel = 0; iChannel < channels; ++iChannel) {
                          void* pDst = ma_offset_ptr(pInterleavedPCMFrames, (iPCMFrame*channels+iChannel)*sampleSizeInBytes);
                    const void* pSrc = ma_offset_ptr(ppDeinterleavedPCMFrames[iChannel], iPCMFrame*sampleSizeInBytes);
                    memcpy(pDst, pSrc, sampleSizeInBytes);
                }
            }
        } break;
    }
}